

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::writeHex(MidiFile *this,string *filename,int width)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined1 local_238 [8];
  fstream output;
  ostream local_228 [516];
  int local_24;
  string *psStack_20;
  int width_local;
  string *filename_local;
  MidiFile *this_local;
  
  local_24 = width;
  psStack_20 = filename;
  filename_local = (string *)this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::fstream::fstream(local_238,pcVar3,_S_out);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: could not write: ");
    poVar4 = std::operator<<(poVar4,(string *)psStack_20);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  else {
    bVar2 = writeHex(this,local_228,local_24);
    this->m_rwstatus = bVar2;
    std::fstream::close();
    this_local._7_1_ = this->m_rwstatus & 1;
  }
  std::fstream::~fstream(local_238);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MidiFile::writeHex(const std::string& filename, int width) {
	std::fstream output(filename.c_str(), std::ios::out);
	if (!output.is_open()) {
		std::cerr << "Error: could not write: " << filename << std::endl;
		return false;
	}
	m_rwstatus = writeHex(output, width);
	output.close();
	return m_rwstatus;
}